

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool player_get_resume_normal_shape(player *p,command *cmd)

{
  _Bool _Var1;
  char cVar2;
  char *pcVar3;
  _Bool _Var4;
  char prompt [100];
  
  _Var1 = player_is_shapechanged(p);
  _Var4 = true;
  if (_Var1) {
    msg("You cannot do this while in %s form.",p->shape->name);
    pcVar3 = cmd_verb(cmd->code);
    strnfmt(prompt,100,"Change back and %s (y/n) or (r)eturn to normal? ",pcVar3);
    cVar2 = get_char(prompt,"yrn",3,'n');
    _Var4 = cVar2 == 'y';
    if ((_Var4) || (cVar2 == 'r')) {
      player_resume_normal_shape(p);
    }
  }
  return _Var4;
}

Assistant:

bool player_get_resume_normal_shape(struct player *p, struct command *cmd)
{
	if (player_is_shapechanged(p)) {
		msg("You cannot do this while in %s form.", p->shape->name);
		char prompt[100];
		strnfmt(prompt, sizeof(prompt),
		        "Change back and %s (y/n) or (r)eturn to normal? ",
		        cmd_verb(cmd->code));
		char answer = get_char(prompt, "yrn", 3, 'n');

		// Change back to normal shape
		if (answer == 'y' || answer == 'r') {
			player_resume_normal_shape(p);
		}

		// Players may only act if they return to normal shape
		return answer == 'y';
	}

	// Normal shape players can proceed as usual
	return true;
}